

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  undefined1 local_f0 [8];
  CField field;
  
  field.beer.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node._M_size._4_4_ = 0;
  CField::CField((CField *)local_f0);
  CField::read((CField *)local_f0,in_ESI,__buf,in_RCX);
  CField::solve((CField *)local_f0);
  field.beer.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node._M_size._4_4_ = 0;
  CField::~CField((CField *)local_f0);
  return field.beer.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl._M_node._M_size._4_4_;
}

Assistant:

int main()
{
    CField field;

    field.read();
    field.solve();

    return 0;
}